

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psobjs.c
# Opt level: O3

FT_Int ps_parser_to_coord_array(PS_Parser parser,FT_Int max_coords,FT_Short *coords)

{
  byte *limit;
  byte bVar1;
  ulong uVar2;
  FT_Fixed FVar3;
  long lVar4;
  byte *pbVar5;
  byte *local_40;
  undefined4 local_38;
  uint local_34;
  
  skip_spaces(&parser->cursor,parser->limit);
  limit = parser->limit;
  local_40 = parser->cursor;
  lVar4 = 0;
  if (limit <= local_40) goto LAB_002072b2;
  if (*local_40 == 0x5b) {
    local_34 = 0x5d;
LAB_002071c7:
    local_40 = local_40 + 1;
    local_38 = 0;
  }
  else {
    if (*local_40 == 0x7b) {
      local_34 = 0x7d;
      goto LAB_002071c7;
    }
    local_34 = 0;
    local_38 = 1;
  }
  lVar4 = 0;
  do {
    if (limit <= local_40) break;
    do {
      uVar2 = (ulong)*local_40;
      pbVar5 = local_40;
      if (0x25 < uVar2) break;
      if ((0x100003601U >> (uVar2 & 0x3f) & 1) == 0) {
        if (uVar2 != 0x25) break;
        bVar1 = 0x25;
        while (((pbVar5 = local_40 + 1, bVar1 != 10 && (bVar1 != 0xd)) &&
               (local_40 = limit, pbVar5 != limit))) {
          bVar1 = *pbVar5;
          local_40 = pbVar5;
        }
      }
      local_40 = local_40 + 1;
      pbVar5 = local_40;
    } while (local_40 < limit);
    local_40 = pbVar5;
    if (limit <= pbVar5) break;
    if (local_34 == *pbVar5) {
      local_40 = pbVar5 + 1;
      break;
    }
    if (max_coords <= lVar4 && coords != (FT_Short *)0x0) break;
    FVar3 = PS_Conv_ToFixed(&local_40,limit,0);
    if (coords != (FT_Short *)0x0) {
      coords[lVar4] = (FT_Short)((ulong)FVar3 >> 0x10);
    }
    if (pbVar5 == local_40) {
      lVar4 = 0xffffffff;
      break;
    }
    lVar4 = lVar4 + 1;
  } while ((char)local_38 == '\0');
LAB_002072b2:
  parser->cursor = local_40;
  return (FT_Int)lVar4;
}

Assistant:

FT_LOCAL_DEF( FT_Int )
  ps_parser_to_coord_array( PS_Parser  parser,
                            FT_Int     max_coords,
                            FT_Short*  coords )
  {
    ps_parser_skip_spaces( parser );
    return ps_tocoordarray( &parser->cursor, parser->limit,
                            max_coords, coords );
  }